

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase745::run(TestCase745 *this)

{
  bool bVar1;
  Directory *pDVar2;
  File *this_00;
  ReadableFile *this_01;
  bool local_149;
  void *pvStack_148;
  bool _kj_shouldLog_1;
  Array<kj::String> local_140;
  DebugExpression<kj::Array<kj::String>_> local_128;
  undefined1 local_110 [8];
  DebugComparison<kj::Array<kj::String>,_std::nullptr_t> _kjCondition_1;
  undefined1 local_d0 [7];
  bool _kj_shouldLog;
  DebugExpression<kj::String> local_b8;
  undefined1 local_a0 [8];
  DebugComparison<kj::String,_const_char_(&)[7]> _kjCondition;
  undefined1 local_58 [8];
  Own<const_kj::File,_std::nullptr_t> file;
  undefined1 local_38 [8];
  Own<kj::Directory,_std::nullptr_t> dir;
  TempDir tempDir;
  TestCase745 *this_local;
  
  TempDir::TempDir((TempDir *)&dir.ptr);
  TempDir::get((TempDir *)local_38);
  pDVar2 = Own<kj::Directory,_std::nullptr_t>::operator->
                     ((Own<kj::Directory,_std::nullptr_t> *)local_38);
  (*(pDVar2->super_ReadableDirectory).super_FsNode._vptr_FsNode[0xf])(local_58);
  this_00 = Own<const_kj::File,_std::nullptr_t>::operator->
                      ((Own<const_kj::File,_std::nullptr_t> *)local_58);
  StringPtr::StringPtr((StringPtr *)&_kjCondition.result,"foobar");
  File::writeAll(this_00,(StringPtr)stack0xffffffffffffff98);
  this_01 = &Own<const_kj::File,_std::nullptr_t>::operator->
                       ((Own<const_kj::File,_std::nullptr_t> *)local_58)->super_ReadableFile;
  ReadableFile::readAllText((String *)local_d0,this_01);
  kj::_::DebugExpressionStart::operator<<
            (&local_b8,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(String *)local_d0);
  kj::_::DebugExpression<kj::String>::operator==
            ((DebugComparison<kj::String,_const_char_(&)[7]> *)local_a0,&local_b8,
             (char (*) [7])0x942b88);
  kj::_::DebugExpression<kj::String>::~DebugExpression(&local_b8);
  String::~String((String *)local_d0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_a0);
  if (!bVar1) {
    _kjCondition_1._55_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_1._55_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[49],kj::_::DebugComparison<kj::String,char_const(&)[7]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
                 ,0x2ee,ERROR,
                 "\"failed: expected \" \"file->readAllText() == \\\"foobar\\\"\", _kjCondition",
                 (char (*) [49])"failed: expected file->readAllText() == \"foobar\"",
                 (DebugComparison<kj::String,_const_char_(&)[7]> *)local_a0);
      _kjCondition_1._55_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::String,_const_char_(&)[7]>::~DebugComparison
            ((DebugComparison<kj::String,_const_char_(&)[7]> *)local_a0);
  pDVar2 = Own<kj::Directory,_std::nullptr_t>::operator->
                     ((Own<kj::Directory,_std::nullptr_t> *)local_38);
  (*(pDVar2->super_ReadableDirectory).super_FsNode._vptr_FsNode[6])(&local_140);
  kj::_::DebugExpressionStart::operator<<
            (&local_128,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_140);
  pvStack_148 = (void *)0x0;
  kj::_::DebugExpression<kj::Array<kj::String>>::operator==
            ((DebugComparison<kj::Array<kj::String>,_std::nullptr_t> *)local_110,
             (DebugExpression<kj::Array<kj::String>> *)&local_128,&stack0xfffffffffffffeb8);
  kj::_::DebugExpression<kj::Array<kj::String>_>::~DebugExpression(&local_128);
  Array<kj::String>::~Array(&local_140);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_110);
  if (!bVar1) {
    local_149 = kj::_::Debug::shouldLog(ERROR);
    while (local_149 != false) {
      kj::_::Debug::
      log<char_const(&)[45],kj::_::DebugComparison<kj::Array<kj::String>,decltype(nullptr)>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
                 ,0x2ef,ERROR,"\"failed: expected \" \"dir->listNames() == nullptr\", _kjCondition",
                 (char (*) [45])"failed: expected dir->listNames() == nullptr",
                 (DebugComparison<kj::Array<kj::String>,_std::nullptr_t> *)local_110);
      local_149 = false;
    }
  }
  kj::_::DebugComparison<kj::Array<kj::String>,_std::nullptr_t>::~DebugComparison
            ((DebugComparison<kj::Array<kj::String>,_std::nullptr_t> *)local_110);
  Own<const_kj::File,_std::nullptr_t>::~Own((Own<const_kj::File,_std::nullptr_t> *)local_58);
  Own<kj::Directory,_std::nullptr_t>::~Own((Own<kj::Directory,_std::nullptr_t> *)local_38);
  TempDir::~TempDir((TempDir *)&dir.ptr);
  return;
}

Assistant:

TEST(AsyncIo, ScmRightsTruncatedOdd) {
  // Test that if we send two FDs over a unix socket, but the receiving end only receives one, we
  // don't leak the other FD.

  auto io = setupAsyncIo();

  auto capPipe = io.provider->newCapabilityPipe();

  int pipeFds[2]{};
  KJ_SYSCALL(miniposix::pipe(pipeFds));
  kj::OwnFd in1(pipeFds[0]);
  kj::OwnFd out1(pipeFds[1]);

  KJ_SYSCALL(miniposix::pipe(pipeFds));
  kj::OwnFd in2(pipeFds[0]);
  kj::OwnFd out2(pipeFds[1]);

  {
    OwnFd sendFds[2] = { kj::mv(out1), kj::mv(out2) };
    capPipe.ends[0]->writeWithFds("foo"_kjb, nullptr, sendFds).wait(io.waitScope);
  }

  {
    char buffer[4]{};
    OwnFd fdBuffer[1];
    auto result = capPipe.ends[1]->tryReadWithFds(buffer, 3, 3, fdBuffer, 1).wait(io.waitScope);
    KJ_ASSERT(result.capCount == 1);
    kj::FdOutputStream(fdBuffer[0].get()).write("bar"_kjb);
  }

  // We want to carefully verify that out1 and out2 were closed, without deadlocking if they
  // weren't. So we manually set nonblocking mode and then issue read()s.
  KJ_SYSCALL(fcntl(in1, F_SETFL, O_NONBLOCK));
  KJ_SYSCALL(fcntl(in2, F_SETFL, O_NONBLOCK));

  char buffer[4]{};
  ssize_t n;

  // First we read "bar" from in1.
  KJ_NONBLOCKING_SYSCALL(n = read(in1, buffer, 4));
  KJ_ASSERT(n == 3);
  buffer[3] = '\0';
  KJ_ASSERT(kj::StringPtr(buffer) == "bar");

  // Now it should be EOF.
  KJ_NONBLOCKING_SYSCALL(n = read(in1, buffer, 4));
  if (n < 0) {
    KJ_FAIL_ASSERT("out1 was not closed");
  }
  KJ_ASSERT(n == 0);

  // Second pipe should have been closed implicitly because we didn't provide space to receive it.
  KJ_NONBLOCKING_SYSCALL(n = read(in2, buffer, 4));
  if (n < 0) {
    KJ_FAIL_ASSERT("out2 was not closed. This could indicate that your operating system kernel is "
        "buggy and leaks file descriptors when an SCM_RIGHTS message is truncated. FreeBSD was "
        "known to do this until late 2018, while MacOS still has this bug as of this writing in "
        "2019. However, KJ works around the problem on those platforms. You need to enable the "
        "same work-around for your OS -- search for 'SCM_RIGHTS' in src/kj/async-io-unix.c++.");
  }
  KJ_ASSERT(n == 0);
}